

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

char * sx_os_dlerr(void)

{
  char *pcVar1;
  
  pcVar1 = (char *)dlerror();
  return pcVar1;
}

Assistant:

const char* sx_os_dlerr(void)
{
#if SX_PLATFORM_WINDOWS
    static char err_id[32];
    sx_snprintf(err_id, sizeof(err_id), "%u", GetLastError());
    return err_id;
#elif SX_PLATFORM_EMSCRIPTEN || SX_PLATFORM_PS4 || SX_PLATFORM_XBOXONE
    return "";
#else
    return dlerror();
#endif
}